

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O1

void lysc_must_free(lysf_ctx *ctx,lysc_must *must)

{
  lysc_ext_instance *plVar1;
  void *pvVar2;
  void *pvVar3;
  long lVar4;
  
  if (must != (lysc_must *)0x0) {
    lyxp_expr_free(ctx->ctx,must->cond);
    ly_free_prefix_data(LY_VALUE_SCHEMA_RESOLVED,must->prefixes);
    lydict_remove(ctx->ctx,must->emsg);
    lydict_remove(ctx->ctx,must->eapptag);
    lydict_remove(ctx->ctx,must->dsc);
    lydict_remove(ctx->ctx,must->ref);
    lVar4 = 0;
    pvVar3 = (void *)0x0;
    while( true ) {
      plVar1 = must->exts;
      if (plVar1 == (lysc_ext_instance *)0x0) {
        pvVar2 = (void *)0x0;
      }
      else {
        pvVar2 = plVar1[-1].compiled;
      }
      if (pvVar2 <= pvVar3) break;
      lysc_ext_instance_free(ctx,(lysc_ext_instance *)((long)&plVar1->def + lVar4));
      pvVar3 = (void *)((long)pvVar3 + 1);
      lVar4 = lVar4 + 0x48;
    }
    if (plVar1 != (lysc_ext_instance *)0x0) {
      free(&plVar1[-1].compiled);
      return;
    }
  }
  return;
}

Assistant:

static void
lysc_must_free(struct lysf_ctx *ctx, struct lysc_must *must)
{
    if (!must) {
        return;
    }

    lyxp_expr_free(ctx->ctx, must->cond);
    ly_free_prefix_data(LY_VALUE_SCHEMA_RESOLVED, must->prefixes);
    lydict_remove(ctx->ctx, must->emsg);
    lydict_remove(ctx->ctx, must->eapptag);
    lydict_remove(ctx->ctx, must->dsc);
    lydict_remove(ctx->ctx, must->ref);
    FREE_ARRAY(ctx, must->exts, lysc_ext_instance_free);
}